

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status
wal_dur_snapshot_open
          (fdb_seqnum_t seqnum,_fdb_key_cmp_info *key_cmp_info,filemgr *file,fdb_txn *txn,
          snap_handle **shandle)

{
  snap_handle *psVar1;
  char *in_RCX;
  fdb_txn *in_RDX;
  filemgr *in_RSI;
  snap_handle *in_RDI;
  _fdb_key_cmp_info *in_R8;
  fdb_kvs_id_t kv_id;
  snap_handle *_shandle;
  wal_snapid_t in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc0;
  wal_snapid_t snap_tag;
  fdb_kvs_id_t in_stack_ffffffffffffffc8;
  fdb_status local_4;
  
  if (in_RDI == (snap_handle *)0xffffffffffffffff) {
    fdb_assert_die((char *)in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc0);
  }
  if ((in_RSI->pos).super___atomic_base<unsigned_long>._M_i == 0) {
    snap_tag = 0;
  }
  else {
    snap_tag = *(wal_snapid_t *)((in_RSI->pos).super___atomic_base<unsigned_long>._M_i + 8);
  }
  psVar1 = _wal_snapshot_create(in_stack_ffffffffffffffc8,snap_tag,in_stack_ffffffffffffffb8);
  if (psVar1 == (snap_handle *)0x0) {
    local_4 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    pthread_spin_lock((pthread_spinlock_t *)(in_RDX[1].prev_hdr_bid + 0x60));
    _wal_snapshot_init(in_RDI,in_RSI,in_RDX,(fdb_seqnum_t)in_RCX,in_R8);
    pthread_spin_unlock((pthread_spinlock_t *)(in_RDX[1].prev_hdr_bid + 0x60));
    *(snap_handle **)&in_R8->kvs_config = psVar1;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status wal_dur_snapshot_open(fdb_seqnum_t seqnum,
                                 _fdb_key_cmp_info *key_cmp_info,
                                 struct filemgr *file, fdb_txn *txn,
                                 struct snap_handle **shandle)
{
    struct snap_handle *_shandle;
    fdb_kvs_id_t kv_id;
    fdb_assert(seqnum != FDB_SNAPSHOT_INMEM, seqnum, key_cmp_info->kvs);
    if (!key_cmp_info->kvs) {
        kv_id = 0;
    } else {
        kv_id = key_cmp_info->kvs->id;
    }
    _shandle = _wal_snapshot_create(kv_id, 0, 0);
    if (!_shandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP
    spin_lock(&file->wal->lock);
    _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
    spin_unlock(&file->wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}